

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O3

string * trim(string *str,string *chars)

{
  rtrim(str,chars);
  std::__cxx11::string::find_first_not_of((char *)str,(ulong)(chars->_M_dataplus)._M_p,0);
  std::__cxx11::string::erase((ulong)str,0);
  return str;
}

Assistant:

std::string& trim(std::string& str, const std::string& chars) {
  return ltrim(rtrim(str, chars), chars);
}